

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser_exp3::~UnitTest_parser_exp3(UnitTest_parser_exp3 *this)

{
  UnitTestBase::~UnitTestBase(&this->super_UnitTestBase);
  return;
}

Assistant:

TEST_CASE(parser_exp3)
{
    auto root = Parse("a = -1 + -1 ^ 2 ^ 2");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // -1
    auto left = dynamic_cast<luna::UnaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '-');

    // -(1 ^ 2 ^ 2)
    auto right = dynamic_cast<luna::UnaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '-');

    bin_exp = dynamic_cast<luna::BinaryExpression *>(right->exp_.get());
    EXPECT_TRUE(bin_exp);

    // 1 ^
    EXPECT_TRUE(bin_exp->op_token_.token_ == '^');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->left_.get()));

    // 2 ^ 2
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '^');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));
}